

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::replace_path_prefix
               (SmallVectorImpl<char> *Path,StringRef *OldPrefix,StringRef *NewPrefix,Style style)

{
  bool bVar1;
  char *__n;
  StringRef Prefix;
  undefined1 local_1b8 [8];
  SmallString<256U> NewPath;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  undefined1 local_48 [8];
  StringRef OrigPath;
  StringRef RelPath;
  
  if (NewPrefix->Length != 0 || OldPrefix->Length != 0) {
    local_48 = (undefined1  [8])
               (Path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    OrigPath.Data =
         (char *)(ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Prefix.Length = OldPrefix->Length;
    Prefix.Data = OldPrefix->Data;
    bVar1 = StringRef::startswith((StringRef *)local_48,Prefix);
    if (bVar1) {
      __n = (char *)OldPrefix->Length;
      if (__n == (char *)NewPrefix->Length) {
        if (__n != (char *)0x0) {
          memmove((Path->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                  NewPrefix->Data,(size_t)__n);
        }
      }
      else {
        if (OrigPath.Data < __n) {
          __n = OrigPath.Data;
        }
        OrigPath.Length = (size_t)(__n + (long)local_48);
        local_1b8 = (undefined1  [8])
                    &NewPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        NewPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX = (void *)0x10000000000;
        Twine::Twine((Twine *)(NewPath.super_SmallVector<char,_256U>.
                               super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),NewPrefix);
        Twine::Twine(&local_90,"");
        Twine::Twine(&local_78,"");
        Twine::Twine(&local_60,"");
        append((SmallVectorImpl<char> *)local_1b8,style,
               (Twine *)(NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                         InlineElts + 0xf8),&local_90,&local_78,&local_60);
        Twine::Twine((Twine *)(NewPath.super_SmallVector<char,_256U>.
                               super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),
                     (StringRef *)&OrigPath.Length);
        Twine::Twine(&local_90,"");
        Twine::Twine(&local_78,"");
        Twine::Twine(&local_60,"");
        append((SmallVectorImpl<char> *)local_1b8,style,
               (Twine *)(NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                         InlineElts + 0xf8),&local_90,&local_78,&local_60);
        SmallVectorImpl<char>::swap(Path,(SmallVectorImpl<char> *)local_1b8);
        SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_1b8);
      }
    }
  }
  return;
}

Assistant:

void replace_path_prefix(SmallVectorImpl<char> &Path,
                         const StringRef &OldPrefix, const StringRef &NewPrefix,
                         Style style) {
  if (OldPrefix.empty() && NewPrefix.empty())
    return;

  StringRef OrigPath(Path.begin(), Path.size());
  if (!OrigPath.startswith(OldPrefix))
    return;

  // If prefixes have the same size we can simply copy the new one over.
  if (OldPrefix.size() == NewPrefix.size()) {
    llvm::copy(NewPrefix, Path.begin());
    return;
  }

  StringRef RelPath = OrigPath.substr(OldPrefix.size());
  SmallString<256> NewPath;
  path::append(NewPath, style, NewPrefix);
  path::append(NewPath, style, RelPath);
  Path.swap(NewPath);
}